

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O1

char * TiXmlBase::ReadName(char *p,TiXmlString *name,TiXmlEncoding encoding)

{
  byte *pbVar1;
  byte bVar2;
  int iVar3;
  char *pcVar4;
  bool bVar5;
  
  TiXmlString::assign(name,"",0);
  if (p == (char *)0x0) {
    __assert_fail("p",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxmlparser.cpp"
                  ,0x197,
                  "static const char *TiXmlBase::ReadName(const char *, TiXmlString *, TiXmlEncoding)"
                 );
  }
  bVar2 = *p;
  if (bVar2 != 0) {
    bVar5 = true;
    if (bVar2 < 0x7f) {
      iVar3 = isalpha((uint)bVar2);
      bVar5 = iVar3 != 0;
    }
    if ((bVar2 == 0x5f) || (bVar5)) {
      bVar2 = *p;
      pcVar4 = p;
      while (bVar2 != 0) {
        if (bVar2 < 0x7f) {
          iVar3 = isalnum((uint)bVar2);
          if ((iVar3 == 0) &&
             ((0x32 < bVar2 - 0x2d ||
              ((0x4000000002003U >> ((ulong)(bVar2 - 0x2d) & 0x3f) & 1) == 0)))) break;
        }
        pbVar1 = (byte *)(pcVar4 + 1);
        pcVar4 = pcVar4 + 1;
        bVar2 = *pbVar1;
      }
      if ((long)pcVar4 - (long)p < 1) {
        return pcVar4;
      }
      TiXmlString::assign(name,p,(long)pcVar4 - (long)p);
      return pcVar4;
    }
  }
  return (char *)0x0;
}

Assistant:

const char* TiXmlBase::ReadName( const char* p, TIXML_STRING * name, TiXmlEncoding encoding )
{
	// Oddly, not supported on some comilers,
	//name->clear();
	// So use this:
	*name = "";
	assert( p );

	// Names start with letters or underscores.
	// Of course, in unicode, tinyxml has no idea what a letter *is*. The
	// algorithm is generous.
	//
	// After that, they can be letters, underscores, numbers,
	// hyphens, or colons. (Colons are valid ony for namespaces,
	// but tinyxml can't tell namespaces from names.)
	if (    p && *p 
		 && ( IsAlpha( (unsigned char) *p, encoding ) || *p == '_' ) )
	{
		const char* start = p;
		while(		p && *p
				&&	(		IsAlphaNum( (unsigned char ) *p, encoding ) 
						 || *p == '_'
						 || *p == '-'
						 || *p == '.'
						 || *p == ':' ) )
		{
			//(*name) += *p; // expensive
			++p;
		}
		if ( p-start > 0 ) {
			name->assign( start, p-start );
		}
		return p;
	}
	return 0;
}